

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

int64_t cab_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  void *pvVar1;
  bool bVar2;
  wchar_t wVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t iVar6;
  ulong uVar7;
  long lVar8;
  ssize_t avail;
  ulong local_58;
  int64_t local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  pvVar1 = a->format->data;
  uVar4 = cab_minimum_consume_cfdata(a,consumed_bytes);
  if ((long)uVar4 < 0) {
    local_50 = -0x1e;
  }
  else {
    local_50 = consumed_bytes;
    if (uVar4 != 0) {
      lVar8 = *(long *)((long)pvVar1 + 0x38);
      local_48 = 1;
      local_38 = 3;
      local_40 = 2;
      if ((ulong)*(ushort *)(lVar8 + 4) == 0) {
        archive_set_error(&a->archive,0x54,"Invalid CFDATA");
        iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[local_48]))();
        return iVar6;
      }
      uVar5 = (ulong)*(ushort *)(lVar8 + 10);
      uVar7 = uVar5;
      if ((long)uVar4 < (long)uVar5) {
        uVar7 = uVar4;
      }
      if ((*(short *)(lVar8 + 0xc) == 0) &&
         ((*(ushort *)(*(long *)((long)pvVar1 + 0x30) + 0x10) | 2) == 0xffff)) {
        if ((long)uVar4 < (long)uVar5) {
          *(short *)(lVar8 + 0xe) = *(short *)(lVar8 + 0xe) + (short)uVar7;
          *(ushort *)(lVar8 + 10) = *(ushort *)(lVar8 + 10) - (short)uVar7;
          return consumed_bytes;
        }
        __archive_read_consume(a,(ulong)*(ushort *)(lVar8 + 4));
        *(long *)((long)pvVar1 + 0x40) =
             *(long *)((long)pvVar1 + 0x40) + (ulong)*(ushort *)(lVar8 + 4);
        *(undefined2 *)(lVar8 + 6) = 0;
        *(undefined2 *)(lVar8 + 10) = 0;
        wVar3 = cab_next_cfdata(a);
        if (wVar3 < L'\0') {
          iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[local_48]))();
          return iVar6;
        }
        lVar8 = 2;
        if (*(short *)(*(long *)((long)pvVar1 + 0x38) + 8) == 0) {
          iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[local_40]))();
          return iVar6;
        }
      }
      else if (uVar5 == 0) {
        wVar3 = cab_next_cfdata(a);
        if (wVar3 < L'\0') {
          iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[local_48]))();
          return iVar6;
        }
        if ((*(short *)(*(long *)((long)pvVar1 + 0x38) + 8) != 0) ||
           (*(ushort *)(*(long *)((long)pvVar1 + 0x30) + 0x10) < 0xfffd)) {
          iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[local_40]))();
          return iVar6;
        }
LAB_001427d5:
        lVar8 = 1;
      }
      else {
        do {
          cab_read_ahead_cfdata(a,(ssize_t *)&local_58);
          if ((long)local_58 < 1) goto LAB_001427d5;
          if ((long)uVar7 < (long)local_58) {
            local_58 = uVar7;
          }
          iVar6 = cab_minimum_consume_cfdata(a,local_58);
          if (iVar6 < 0) goto LAB_001427d5;
          uVar4 = uVar7 - local_58;
          bVar2 = (long)local_58 <= (long)uVar7;
          uVar7 = uVar4;
        } while (uVar4 != 0 && bVar2);
        lVar8 = 0;
      }
      iVar6 = (*(code *)((long)&DAT_0024b910 + (long)(int)(&DAT_0024b910)[lVar8]))();
      return iVar6;
    }
  }
  return local_50;
}

Assistant:

static int64_t
cab_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	rbytes = cab_minimum_consume_cfdata(a, consumed_bytes);
	if (rbytes < 0)
		return (ARCHIVE_FATAL);

	cfdata = cab->entry_cfdata;
	while (rbytes > 0) {
		ssize_t avail;

		if (cfdata->compressed_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		}
		cbytes = cfdata->uncompressed_bytes_remaining;
		if (cbytes > rbytes)
			cbytes = rbytes;
		rbytes -= cbytes;

		if (cfdata->uncompressed_avail == 0 &&
		   (cab->entry_cffile->folder == iFoldCONTINUED_PREV_AND_NEXT ||
		    cab->entry_cffile->folder == iFoldCONTINUED_FROM_PREV)) {
			/* We have not read any data yet. */
			if (cbytes == cfdata->uncompressed_bytes_remaining) {
				/* Skip whole current CFDATA. */
				__archive_read_consume(a,
				    cfdata->compressed_size);
				cab->cab_offset += cfdata->compressed_size;
				cfdata->compressed_bytes_remaining = 0;
				cfdata->uncompressed_bytes_remaining = 0;
				err = cab_next_cfdata(a);
				if (err < 0)
					return (err);
				cfdata = cab->entry_cfdata;
				if (cfdata->uncompressed_size == 0) {
					switch (cab->entry_cffile->folder) {
					case iFoldCONTINUED_PREV_AND_NEXT:
					case iFoldCONTINUED_TO_NEXT:
					case iFoldCONTINUED_FROM_PREV:
						rbytes = 0;
						break;
					default:
						break;
					}
				}
				continue;
			}
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
			break;
		} else if (cbytes == 0) {
			err = cab_next_cfdata(a);
			if (err < 0)
				return (err);
			cfdata = cab->entry_cfdata;
			if (cfdata->uncompressed_size == 0) {
				switch (cab->entry_cffile->folder) {
				case iFoldCONTINUED_PREV_AND_NEXT:
				case iFoldCONTINUED_TO_NEXT:
				case iFoldCONTINUED_FROM_PREV:
					return (ARCHIVE_FATAL);
				default:
					break;
				}
			}
			continue;
		}
		while (cbytes > 0) {
			(void)cab_read_ahead_cfdata(a, &avail);
			if (avail <= 0)
				return (ARCHIVE_FATAL);
			if (avail > cbytes)
				avail = (ssize_t)cbytes;
			if (cab_minimum_consume_cfdata(a, avail) < 0)
				return (ARCHIVE_FATAL);
			cbytes -= avail;
		}
	}
	return (consumed_bytes);
}